

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

void __thiscall
ezc3d::c3d::frames(c3d *this,
                  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *frames,
                  size_t firstFrameidx)

{
  size_type sVar1;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *in_RSI;
  bool skipInternalUpdates;
  size_t i;
  undefined1 in_stack_000003cf;
  size_t in_stack_000003d0;
  Frame *in_stack_000003d8;
  c3d *in_stack_000003e0;
  ulong local_20;
  
  for (local_20 = 0;
      sVar1 = std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::size(in_RSI)
      , local_20 < sVar1; local_20 = local_20 + 1) {
    if (local_20 != 0) {
      std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::size(in_RSI);
    }
    std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::operator[]
              (in_RSI,local_20);
    frame(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,(bool)in_stack_000003cf);
  }
  return;
}

Assistant:

void ezc3d::c3d::frames(const std::vector<ezc3d::DataNS::Frame> frames,
                        size_t firstFrameidx) {

  for (size_t i = 0; i < frames.size(); i++) {
    // Only performs internal updates on the first and last frames
    bool skipInternalUpdates = i > 0 && i < frames.size() - 1;
    frame(frames[i], firstFrameidx == SIZE_MAX ? SIZE_MAX : firstFrameidx + i,
          skipInternalUpdates);
  }
}